

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_start_handshake_msg
              (mbedtls_ssl_context *ssl,uint hs_type,uchar **buf,size_t *buf_len)

{
  *buf = ssl->out_msg + 4;
  *buf_len = 0x3fc;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = (uchar)hs_type;
  return 0;
}

Assistant:

int mbedtls_ssl_start_handshake_msg(mbedtls_ssl_context *ssl, unsigned hs_type,
                                    unsigned char **buf, size_t *buf_len)
{
    /*
     * Reserve 4 bytes for handshake header. ( Section 4,RFC 8446 )
     *    ...
     *    HandshakeType msg_type;
     *    uint24 length;
     *    ...
     */
    *buf = ssl->out_msg + 4;
    *buf_len = MBEDTLS_SSL_OUT_CONTENT_LEN - 4;

    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = hs_type;

    return 0;
}